

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sock.c
# Opt level: O2

int nn_sock_setopt(nn_sock *self,int level,int option,void *optval,size_t optvallen)

{
  uint uVar1;
  _func_int_nn_sockbase_ptr_int_int_void_ptr_size_t *p_Var2;
  int iVar3;
  nn_optset *pnVar4;
  
  nn_ctx_enter(&self->ctx);
  if (level < 1) {
    if (level < 0) {
      pnVar4 = nn_sock_optset(self,level);
      if (pnVar4 != (nn_optset *)0x0) {
        iVar3 = (*pnVar4->vfptr->setopt)(pnVar4,option,optval,optvallen);
        goto LAB_0011395d;
      }
    }
    else {
      if (option == 0xf) {
        if (0x3f < optvallen) {
          iVar3 = -0x16;
          goto LAB_0011395d;
        }
        memcpy(self->socket_name,optval,optvallen);
        self->socket_name[optvallen] = '\0';
        goto switchD_0011392c_caseD_1;
      }
      iVar3 = -0x16;
      if (optvallen != 4) goto LAB_0011395d;
      if (option - 1U < 0x11) {
        uVar1 = *optval;
        switch(option) {
        case 1:
          break;
        case 2:
          if ((int)uVar1 < 1) goto LAB_0011395d;
          self->sndbuf = uVar1;
          break;
        case 3:
          if ((int)uVar1 < 1) goto LAB_0011395d;
          self->rcvbuf = uVar1;
          break;
        case 4:
          self->sndtimeo = uVar1;
          break;
        case 5:
          self->rcvtimeo = uVar1;
          break;
        case 6:
          if ((int)uVar1 < 0) goto LAB_0011395d;
          self->reconnect_ivl = uVar1;
          break;
        case 7:
          if ((int)uVar1 < 0) goto LAB_0011395d;
          self->reconnect_ivl_max = uVar1;
          break;
        case 8:
          if (uVar1 - 0x11 < 0xfffffff0) goto LAB_0011395d;
          (self->ep_template).sndprio = uVar1;
          break;
        case 9:
          if (uVar1 - 0x11 < 0xfffffff0) goto LAB_0011395d;
          (self->ep_template).rcvprio = uVar1;
          break;
        default:
          goto switchD_0011392c_caseD_a;
        case 0xe:
          if (1 < uVar1) goto LAB_0011395d;
          (self->ep_template).ipv4only = uVar1;
          break;
        case 0x10:
          if ((int)uVar1 < -1) goto LAB_0011395d;
          self->rcvmaxsize = uVar1;
          break;
        case 0x11:
          if (uVar1 - 0x100 < 0xffffff01) goto LAB_0011395d;
          self->maxttl = uVar1;
        }
switchD_0011392c_caseD_1:
        iVar3 = 0;
        goto LAB_0011395d;
      }
    }
  }
  else {
    p_Var2 = self->sockbase->vfptr->setopt;
    if (p_Var2 != (_func_int_nn_sockbase_ptr_int_int_void_ptr_size_t *)0x0) {
      iVar3 = (*p_Var2)(self->sockbase,level,option,optval,optvallen);
      goto LAB_0011395d;
    }
  }
switchD_0011392c_caseD_a:
  iVar3 = -0x5c;
LAB_0011395d:
  nn_ctx_leave(&self->ctx);
  return iVar3;
}

Assistant:

int nn_sock_setopt (struct nn_sock *self, int level, int option,
    const void *optval, size_t optvallen)
{
    int rc;

    nn_ctx_enter (&self->ctx);
    rc = nn_sock_setopt_inner (self, level, option, optval, optvallen);
    nn_ctx_leave (&self->ctx);

    return rc;
}